

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,ArrayPtr<const_char> *param_5)

{
  char *__s;
  char *pcVar1;
  char *local_38;
  size_t local_30;
  StringPtr local_28;
  
  __s = (char *)*param_2;
  local_30 = strlen(__s);
  pcVar1 = (char *)param_2[2];
  local_28.content.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_28.content.ptr = (char *)param_2[1];
  }
  local_28.content.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_28.content.size_ = (size_t)(pcVar1 + -1);
  }
  local_38 = __s;
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)(param_2 + 4),&local_28,
             param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}